

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_serve_http(mg_connection *nc,http_message *hm,mg_serve_http_opts opts)

{
  ulong uVar1;
  size_t sVar2;
  mg_connection *conn;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  mg_str *pmVar7;
  char *list;
  char cVar8;
  long lVar9;
  size_t __n;
  http_message *phVar10;
  undefined1 *puVar11;
  char *__s;
  char path [4096];
  undefined1 auStack_2078 [8];
  http_message *local_2070;
  mg_str local_2068;
  mg_str local_2058;
  mg_connection *local_2048;
  socklen_t local_203c;
  undefined2 local_2038;
  undefined6 uStack_2036;
  undefined8 uStack_2030;
  undefined4 local_2028;
  sockaddr local_1038 [256];
  
  list = opts.url_rewrites;
  puVar11 = auStack_2078;
  _local_2038 = 0x25;
  uStack_2030 = 0;
  local_2028 = 0;
  local_203c = 8;
  local_1038[0].sa_family = 0;
  local_1038[0].sa_data[0] = '\0';
  local_1038[0].sa_data[1] = '\0';
  local_1038[0].sa_data[2] = '\0';
  local_1038[0].sa_data[3] = '\0';
  local_1038[0].sa_data[4] = '\0';
  local_1038[0].sa_data[5] = '\0';
  local_1038[0].sa_data[6] = '\0';
  local_1038[0].sa_data[7] = '\0';
  local_1038[0].sa_data[8] = '\0';
  local_1038[0].sa_data[9] = '\0';
  local_1038[0].sa_data[10] = '\0';
  local_1038[0].sa_data[0xb] = '\0';
  local_1038[0].sa_data[0xc] = '\0';
  local_1038[0].sa_data[0xd] = '\0';
  local_2070 = hm;
  local_2048 = nc;
  getsockname(nc->sock,local_1038,&local_203c);
  local_2038 = (ushort)(byte)local_2038;
  snprintf((char *)((long)&local_2038 + 1),0x13,"%d",
           (ulong)(ushort)(local_1038[0].sa_data._0_2_ << 8 |
                          (ushort)local_1038[0].sa_data._0_2_ >> 8));
  __s = (char *)&local_2038;
  pcVar5 = list;
  do {
    pcVar5 = mg_next_comma_list_entry(pcVar5,&local_2058,&local_2068);
    phVar10 = local_2070;
    if (pcVar5 == (char *)0x0) goto LAB_0010ff8d;
    sVar6 = strlen(__s);
    sVar2 = local_2058.len;
    __n = local_2058.len;
    if (sVar6 <= local_2058.len) {
      __n = sVar6;
    }
    iVar3 = bcmp(local_2058.p,__s,__n);
    conn = local_2048;
  } while ((int)sVar2 != (int)sVar6 || iVar3 != 0);
  mg_printf(local_2048,"HTTP/1.1 %d %s\r\n",0x12d,"Moved");
  phVar10 = local_2070;
  mg_printf(conn,"Content-Length: 0\r\nLocation: %.*s%.*s\r\n\r\n",(ulong)(uint)local_2068.len,
            local_2068.p);
  if (pcVar5 == (char *)0x0) {
LAB_0010ff8d:
    if (opts.document_root == (char *)0x0) {
      opts.document_root = ".";
    }
    if (opts.per_directory_auth_file == (char *)0x0) {
      opts.per_directory_auth_file = ".htpasswd";
    }
    if (opts.enable_directory_listing == (char *)0x0) {
      opts.enable_directory_listing = "yes";
    }
    if (opts.cgi_file_pattern == (char *)0x0) {
      opts.cgi_file_pattern = "**.cgi$|**.php$";
    }
    if (opts.ssi_pattern == (char *)0x0) {
      opts.ssi_pattern = "**.shtml$|**.shtm$";
    }
    if (opts.index_files == (char *)0x0) {
      opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
    }
    pmVar7 = mg_get_http_header(phVar10,"Host");
    mg_url_decode((phVar10->uri).p,(int)(phVar10->uri).len,__s,0x1000,0);
    if ((byte)local_2038 != '\0') {
      pcVar5 = (char *)&local_2038;
      __s = pcVar5;
      cVar8 = (byte)local_2038;
      do {
        *__s = cVar8;
        cVar8 = *pcVar5;
        pcVar5 = pcVar5 + 1;
        if ((cVar8 == '\\') || (cVar8 == '/')) {
          while( true ) {
            cVar8 = *pcVar5;
            lVar9 = 1;
            if (((cVar8 != '\\') && (cVar8 != '/')) &&
               ((cVar8 != '.' || (lVar9 = 2, pcVar5[1] != '.')))) break;
            pcVar5 = pcVar5 + lVar9;
          }
        }
        __s = __s + 1;
        cVar8 = *pcVar5;
      } while (cVar8 != '\0');
    }
    *__s = '\0';
    snprintf((char *)local_1038,0x1000,"%s%s",opts.document_root,&local_2038);
    iVar3 = is_dav_request(&phVar10->method);
    if ((iVar3 != 0) && (opts.dav_document_root != (char *)0x0)) {
      snprintf((char *)local_1038,0x1000,"%s%s",opts.dav_document_root,&local_2038);
    }
    do {
      list = mg_next_comma_list_entry(list,&local_2058,&local_2068);
      sVar2 = local_2058.len;
      if (list == (char *)0x0) goto LAB_00110185;
      if ((((1 < local_2058.len) && (*local_2058.p == '@' && pmVar7 != (mg_str *)0x0)) &&
          (pmVar7->len == local_2058.len - 1)) &&
         (iVar3 = mg_ncasecmp(local_2058.p + 1,pmVar7->p,local_2058.len - 1), iVar3 == 0))
      goto LAB_00110179;
      uVar4 = mg_match_prefix(local_2058.p,(int)sVar2,(char *)&local_2038);
    } while ((int)uVar4 < 1);
    puVar11 = auStack_2078 + uVar4;
LAB_00110179:
    snprintf((char *)local_1038,0x1000,"%.*s%s",(ulong)(uint)local_2068.len,local_2068.p,
             puVar11 + 0x40);
LAB_00110185:
    phVar10 = local_2070;
    mg_send_http_file(local_2048,(char *)local_1038,0x1000,local_2070,&opts);
    uVar1 = (phVar10->proto).len;
    sVar6 = 8;
    if (uVar1 < 8) {
      sVar6 = uVar1;
    }
    iVar3 = bcmp((phVar10->proto).p,"HTTP/1.1",sVar6);
    if ((int)uVar1 == 8 && iVar3 == 0) {
      mg_get_http_header(phVar10,"Connection");
    }
  }
  return;
}

Assistant:

void mg_serve_http(struct mg_connection *nc, struct http_message *hm,
                   struct mg_serve_http_opts opts) {
    char path[MG_MAX_PATH];
    struct mg_str *hdr;

    if (send_port_based_redirect(nc, hm, &opts)) {
        return;
    }

    if (opts.document_root == NULL) {
        opts.document_root = ".";
    }
    if (opts.per_directory_auth_file == NULL) {
        opts.per_directory_auth_file = ".htpasswd";
    }
    if (opts.enable_directory_listing == NULL) {
        opts.enable_directory_listing = "yes";
    }
    if (opts.cgi_file_pattern == NULL) {
        opts.cgi_file_pattern = "**.cgi$|**.php$";
    }
    if (opts.ssi_pattern == NULL) {
        opts.ssi_pattern = "**.shtml$|**.shtm$";
    }
    if (opts.index_files == NULL) {
        opts.index_files = "index.html,index.htm,index.shtml,index.cgi,index.php";
    }

    uri_to_path(hm, path, sizeof(path), &opts);
    mg_send_http_file(nc, path, sizeof(path), hm, &opts);

    /* Close connection for non-keep-alive requests */
    if (mg_vcmp(&hm->proto, "HTTP/1.1") != 0 ||
        ((hdr = mg_get_http_header(hm, "Connection")) != NULL &&
         mg_vcmp(hdr, "keep-alive") != 0)) {
#if 0
        nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
    }
}